

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::evaluateCollocationConstraintJacobian
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *stateJacobianValues,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *controlJacobianValues)

{
  MatrixDynSize *mat;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  DynamicalSystem *this_00;
  element_type *peVar4;
  double dVar5;
  double dVar6;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *pvVar7;
  MatrixDynSize *mat_00;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *pvVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ostream *poVar20;
  string *psVar21;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  pointer pcVar25;
  ostringstream errorMsg;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_278;
  pointer local_248;
  undefined8 uStack_240;
  double local_230;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *local_228;
  MatrixDynSize *local_220;
  MatrixDynSize *local_218;
  vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_> *local_210;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_208;
  ostringstream local_1e8 [8];
  PointerType local_1e0;
  PointerType pdStack_1d8;
  PointerType local_1d0;
  PointerType local_1c8;
  PointerType pdStack_1c0;
  PointerType local_1b8;
  long local_1b0;
  long lStack_1a8;
  PointerType local_1a0;
  PointerType local_198;
  long lStack_190;
  long local_188;
  ios_base local_178 [264];
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  this_00 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 == (DynamicalSystem *)0x0) {
    psVar21 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar25 = (psVar21->_M_dataplus)._M_p;
    pcVar23 = "evaluateCollocationConstraint";
    pcVar22 = "Dynamical system not set.";
LAB_00173a16:
    iDynTree::reportError(pcVar25,pcVar23,pcVar22);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        local_230 = dT;
        sVar10 = DynamicalSystem::stateSpaceSize(this_00);
        sVar11 = DynamicalSystem::controlSpaceSize
                           ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr
                            .
                            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        if ((long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_start != 0x50) {
          std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                    (stateJacobianValues,2);
        }
        if ((long)(controlJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(controlJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_start != 0x50) {
          std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                    (controlJacobianValues,2);
        }
        uVar12 = iDynTree::MatrixDynSize::rows();
        uVar13 = sVar10 & 0xffffffff;
        if ((uVar12 != uVar13) || (uVar14 = iDynTree::MatrixDynSize::cols(), uVar14 != uVar12)) {
          iDynTree::MatrixDynSize::resize
                    ((ulong)(stateJacobianValues->
                            super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                            )._M_impl.super__Vector_impl_data._M_start,uVar13);
        }
        peVar4 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                 super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_228 = stateJacobianValues;
        iVar9 = (*peVar4->_vptr_DynamicalSystem[3])
                          (peVar4,(controlInputs->
                                  super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
        if ((char)iVar9 == '\0') {
LAB_00173d84:
          psVar21 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar25 = (psVar21->_M_dataplus)._M_p;
          pcVar23 = "evaluateCollocationConstraintJacobian";
          pcVar22 = "Error while setting the control input.";
        }
        else {
          peVar4 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar9 = (*peVar4->_vptr_DynamicalSystem[9])
                            (SUB84(time,0),peVar4,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,&this->m_stateJacBuffer);
          if ((char)iVar9 == '\0') {
LAB_00173da6:
            psVar21 = IntegratorInfo::name_abi_cxx11_
                                (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar25 = (psVar21->_M_dataplus)._M_p;
            pcVar23 = "evaluateCollocationConstraintJacobian";
            pcVar22 = "Error while evaluating the dynamical system jacobian.";
            goto LAB_00173a16;
          }
          local_210 = controlJacobianValues;
          lVar15 = iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          local_220 = &this->m_identity;
          iDynTree::MatrixDynSize::cols();
          lVar16 = iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          local_218 = &this->m_stateJacBuffer;
          iDynTree::MatrixDynSize::cols();
          local_248 = (local_228->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          uVar14 = iDynTree::MatrixDynSize::data();
          lVar17 = iDynTree::MatrixDynSize::rows();
          lVar18 = iDynTree::MatrixDynSize::cols();
          pvVar8 = local_210;
          uVar19 = lVar18 * lVar17;
          uVar12 = uVar19;
          if (((uVar14 & 7) == 0) &&
             (uVar12 = (ulong)((uint)(uVar14 >> 3) & 1), (long)uVar19 <= (long)uVar12)) {
            uVar12 = uVar19;
          }
          local_248 = (pointer)(local_230 * 0.5);
          lVar17 = uVar19 - uVar12;
          if (0 < (long)uVar12) {
            uVar24 = 0;
            do {
              *(double *)(uVar14 + uVar24 * 8) =
                   *(double *)(lVar16 + uVar24 * 8) * (double)local_248 +
                   *(double *)(lVar15 + uVar24 * 8);
              uVar24 = uVar24 + 1;
            } while (uVar12 != uVar24);
          }
          lVar18 = (lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
          if (1 < lVar17) {
            do {
              pdVar2 = (double *)(lVar15 + uVar12 * 8);
              dVar5 = pdVar2[1];
              pdVar1 = (double *)(lVar16 + uVar12 * 8);
              dVar6 = pdVar1[1];
              pdVar3 = (double *)(uVar14 + uVar12 * 8);
              *pdVar3 = *pdVar1 * (double)local_248 + *pdVar2;
              pdVar3[1] = dVar6 * (double)local_248 + dVar5;
              uVar12 = uVar12 + 2;
            } while ((long)uVar12 < lVar18);
          }
          if (lVar18 < (long)uVar19) {
            do {
              *(double *)(uVar14 + lVar18 * 8) =
                   *(double *)(lVar16 + lVar18 * 8) * (double)local_248 +
                   *(double *)(lVar15 + lVar18 * 8);
              lVar18 = lVar18 + 1;
            } while (uVar19 - lVar18 != 0);
          }
          uStack_240 = 0;
          uVar12 = iDynTree::MatrixDynSize::rows();
          if ((uVar12 != uVar13) ||
             (uVar12 = iDynTree::MatrixDynSize::cols(), uVar12 != (sVar11 & 0xffffffff))) {
            iDynTree::MatrixDynSize::resize
                      ((ulong)(pvVar8->
                              super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                              )._M_impl.super__Vector_impl_data._M_start,uVar13);
          }
          peVar4 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          mat = &this->m_controlJacBuffer;
          iVar9 = (*peVar4->_vptr_DynamicalSystem[10])
                            (SUB84(time,0),peVar4,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,mat);
          if ((char)iVar9 != '\0') {
            toEigen(&local_278,mat);
            local_1e0 = (PointerType)
                        local_278.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_rows.m_value;
            pdStack_1d8 = (PointerType)
                          local_278.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value;
            local_1d0 = (PointerType)local_248;
            local_1c8 = local_278.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
            pdStack_1c0 = (PointerType)
                          local_278.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_rows.m_value;
            local_1b8 = (PointerType)
                        local_278.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
            toEigen(&local_208,
                    (pvVar8->
                    super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                    )._M_impl.super__Vector_impl_data._M_start);
            Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
                      ((Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>> *)&local_208,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                        *)local_1e8);
            pvVar7 = local_228;
            uVar12 = iDynTree::MatrixDynSize::rows();
            if ((uVar12 != uVar13) || (uVar12 = iDynTree::MatrixDynSize::cols(), uVar12 != uVar13))
            {
              iDynTree::MatrixDynSize::resize
                        ((ulong)((pvVar7->
                                 super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar13);
            }
            peVar4 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar9 = (*peVar4->_vptr_DynamicalSystem[3])
                              (peVar4,(controlInputs->
                                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x20);
            mat_00 = local_218;
            if ((char)iVar9 == '\0') goto LAB_00173d84;
            peVar4 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            dVar5 = time + local_230;
            iVar9 = (*peVar4->_vptr_DynamicalSystem[9])
                              (peVar4,(collocationPoints->
                                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x20,local_218);
            if ((char)iVar9 == '\0') goto LAB_00173da6;
            toEigen(&local_208,local_220);
            local_278.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value =
                 local_208.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value;
            local_278.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = local_208.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data;
            local_278.
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value =
                 local_208.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
            toEigen(&local_50,mat_00);
            local_198 = local_50.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
            lStack_190 = local_50.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_rows.m_value;
            local_188 = local_50.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
            local_1e0 = local_278.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
            pdStack_1d8 = (PointerType)
                          local_278.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_rows.m_value;
            local_1d0 = (PointerType)
                        local_278.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value;
            local_1b0 = local_50.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_rows.m_value;
            lStack_1a8 = local_50.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_cols.m_value;
            local_1a0 = (PointerType)local_248;
            toEigen(&local_70,
                    (pvVar7->
                    super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x28);
            Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
                      ((Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>> *)&local_70,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                        *)local_1e8);
            uVar12 = iDynTree::MatrixDynSize::rows();
            if ((uVar12 != uVar13) ||
               (uVar12 = iDynTree::MatrixDynSize::cols(), uVar12 != (sVar11 & 0xffffffff))) {
              iDynTree::MatrixDynSize::resize
                        ((ulong)((pvVar8->
                                 super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar13);
            }
            peVar4 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar9 = (*peVar4->_vptr_DynamicalSystem[10])
                              (SUB84(dVar5,0),peVar4,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start + 0x20,mat);
            if ((char)iVar9 != '\0') {
              toEigen(&local_278,mat);
              local_1e0 = (PointerType)
                          local_278.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_rows.m_value;
              pdStack_1d8 = (PointerType)
                            local_278.
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            .m_cols.m_value;
              local_1d0 = (PointerType)local_248;
              local_1c8 = local_278.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              pdStack_1c0 = (PointerType)
                            local_278.
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                            .
                            super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                            .m_rows.m_value;
              local_1b8 = (PointerType)
                          local_278.
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                          .
                          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value;
              toEigen(&local_208,
                      (pvVar8->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start + 0x28);
              Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
                        ((Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>> *)&local_208
                         ,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                           *)local_1e8);
              return true;
            }
          }
          psVar21 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar25 = (psVar21->_M_dataplus)._M_p;
          pcVar23 = "evaluateCollocationConstraintJacobian";
          pcVar22 = "Error while evaluating the dynamical system control jacobian.";
        }
        goto LAB_00173a16;
      }
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "The size of the matrix containing the control inputs does not match the expected one. Input = "
                 ,0x5e);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", Expected = 2.",0xf);
      psVar21 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar22 = (psVar21->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar22,"evaluateCollocationConstraintJacobian",
                 (char *)local_278.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1e8,
                 "The size of the matrix containing the collocation point does not match the expected one. Input = "
                 ,0x61);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,", Expected = 2.",0xf);
      psVar21 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar22 = (psVar21->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar22,"evaluateCollocationConstraintJacobian",
                 (char *)local_278.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    if ((variable_if_dynamic<long,__1> *)
        local_278.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data !=
        &local_278.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols) {
      operator_delete(local_278.
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data,(ulong)(local_278.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                      .m_cols.m_value + 1));
    }
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
    std::ios_base::~ios_base(local_178);
  }
  return false;
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraintJacobian(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                            const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                            std::vector<MatrixDynSize> &stateJacobianValues,
                                                                            std::vector<MatrixDynSize> &controlJacobianValues)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                unsigned int nx = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());
                unsigned int nu = static_cast<unsigned int>(m_dynamicalSystem_ptr->controlSpaceSize());

                if (stateJacobianValues.size() != 2) {
                    stateJacobianValues.resize(2);
                }

                if (controlJacobianValues.size() != 2) {
                    controlJacobianValues.resize(2);
                }

                if ((stateJacobianValues[0].rows() != nx) || (stateJacobianValues[0].cols() != nx)) {
                    stateJacobianValues[0].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[0], time, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[0]) = toEigen(m_identity) + dT/2*toEigen(m_stateJacBuffer);


                if ((controlJacobianValues[0].rows() != nx) || (controlJacobianValues[0].cols() != nu)) {
                    controlJacobianValues[0].resize(nx,nu);
                }


                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[0], time, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[0]) = dT/2.0*toEigen(m_controlJacBuffer);

                if ((stateJacobianValues[1].rows() != nx) || (stateJacobianValues[1].cols() != nx)) {
                    stateJacobianValues[1].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[1], time+dT, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[1]) = -toEigen(m_identity) + dT/2*toEigen(m_stateJacBuffer);


                if ((controlJacobianValues[1].rows() != nx) || (controlJacobianValues[1].cols() != nu)) {
                    controlJacobianValues[1].resize(nx,nu);
                }

                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[1], time + dT, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[1]) = dT/2.0*toEigen(m_controlJacBuffer);

                return true;

            }